

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Locale.cpp
# Opt level: O1

bool __thiscall f8n::i18n::Locale::SetSelectedLocale(Locale *this,string *locale)

{
  pointer pcVar1;
  element_type *peVar2;
  bool bVar3;
  long *plVar4;
  long *plVar5;
  long lVar6;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  __it;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  __it_00;
  string localeFn;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str;
  long *local_f8;
  long local_f0;
  long local_e8;
  long lStack_e0;
  long *local_d8;
  long local_d0;
  long local_c8 [2];
  long *local_b8;
  long local_b0;
  long local_a8;
  long lStack_a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_98;
  long *local_90;
  long local_88;
  long local_80 [2];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  string local_50;
  
  if ((this->defaultLocaleData).m_type == null) {
    pcVar1 = (this->localePath)._M_dataplus._M_p;
    local_d8 = local_c8;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_d8,pcVar1,pcVar1 + (this->localePath)._M_string_length);
    std::__cxx11::string::append((char *)&local_d8);
    plVar4 = (long *)std::__cxx11::string::append((char *)&local_d8);
    plVar5 = plVar4 + 2;
    if ((long *)*plVar4 == plVar5) {
      local_a8 = *plVar5;
      lStack_a0 = plVar4[3];
      local_b8 = &local_a8;
    }
    else {
      local_a8 = *plVar5;
      local_b8 = (long *)*plVar4;
    }
    local_b0 = plVar4[1];
    *plVar4 = (long)plVar5;
    plVar4[1] = 0;
    *(undefined1 *)(plVar4 + 2) = 0;
    plVar4 = (long *)std::__cxx11::string::append((char *)&local_b8);
    plVar5 = plVar4 + 2;
    if ((long *)*plVar4 == plVar5) {
      local_e8 = *plVar5;
      lStack_e0 = plVar4[3];
      local_f8 = &local_e8;
    }
    else {
      local_e8 = *plVar5;
      local_f8 = (long *)*plVar4;
    }
    local_f0 = plVar4[1];
    *plVar4 = (long)plVar5;
    plVar4[1] = 0;
    *(undefined1 *)(plVar4 + 2) = 0;
    loadLocaleData((string *)&local_50.field_2);
    nlohmann::json_abi_v3_11_2::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
    ::operator=(&this->defaultLocaleData,
                (basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                 *)&local_50.field_2);
    nlohmann::json_abi_v3_11_2::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
    ::~basic_json((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                   *)&local_50.field_2);
    if (local_f8 != &local_e8) {
      operator_delete(local_f8,local_e8 + 1);
    }
    if (local_b8 != &local_a8) {
      operator_delete(local_b8,local_a8 + 1);
    }
    if (local_d8 != local_c8) {
      operator_delete(local_d8,local_c8[0] + 1);
    }
  }
  __it_00._M_current =
       (this->locales).
       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_impl.super__Vector_impl_data._M_start;
  local_98 = (this->locales).
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
  local_90 = local_80;
  pcVar1 = (locale->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_90,pcVar1,pcVar1 + locale->_M_string_length);
  local_d8 = local_c8;
  std::__cxx11::string::_M_construct<char*>((string *)&local_d8,local_90,local_88 + (long)local_90);
  local_f8 = &local_e8;
  std::__cxx11::string::_M_construct<char*>((string *)&local_f8,local_d8,local_d0 + (long)local_d8);
  local_b8 = &local_a8;
  std::__cxx11::string::_M_construct<char*>((string *)&local_b8,local_f8,local_f0 + (long)local_f8);
  if (local_f8 != &local_e8) {
    operator_delete(local_f8,local_e8 + 1);
  }
  local_f8 = &local_e8;
  std::__cxx11::string::_M_construct<char*>((string *)&local_f8,local_b8,local_b0 + (long)local_b8);
  lVar6 = (long)local_98 - (long)__it_00._M_current >> 7;
  if (0 < lVar6) {
    lVar6 = lVar6 + 1;
    do {
      bVar3 = __gnu_cxx::__ops::
              _Iter_pred<f8n::i18n::Locale::SetSelectedLocale(std::__cxx11::string_const&)::$_0>::
              operator()((_Iter_pred<f8n::i18n::Locale::SetSelectedLocale(std::__cxx11::string_const&)::__0>
                          *)&local_f8,__it_00);
      __it._M_current = __it_00._M_current;
      if (bVar3) goto LAB_001c4bd4;
      bVar3 = __gnu_cxx::__ops::
              _Iter_pred<f8n::i18n::Locale::SetSelectedLocale(std::__cxx11::string_const&)::$_0>::
              operator()((_Iter_pred<f8n::i18n::Locale::SetSelectedLocale(std::__cxx11::string_const&)::__0>
                          *)&local_f8,__it_00._M_current + 1);
      __it._M_current = __it_00._M_current + 1;
      if (bVar3) goto LAB_001c4bd4;
      bVar3 = __gnu_cxx::__ops::
              _Iter_pred<f8n::i18n::Locale::SetSelectedLocale(std::__cxx11::string_const&)::$_0>::
              operator()((_Iter_pred<f8n::i18n::Locale::SetSelectedLocale(std::__cxx11::string_const&)::__0>
                          *)&local_f8,__it_00._M_current + 2);
      __it._M_current = __it_00._M_current + 2;
      if (bVar3) goto LAB_001c4bd4;
      bVar3 = __gnu_cxx::__ops::
              _Iter_pred<f8n::i18n::Locale::SetSelectedLocale(std::__cxx11::string_const&)::$_0>::
              operator()((_Iter_pred<f8n::i18n::Locale::SetSelectedLocale(std::__cxx11::string_const&)::__0>
                          *)&local_f8,__it_00._M_current + 3);
      __it._M_current = __it_00._M_current + 3;
      if (bVar3) goto LAB_001c4bd4;
      __it_00._M_current = __it_00._M_current + 4;
      lVar6 = lVar6 + -1;
    } while (1 < lVar6);
  }
  lVar6 = (long)local_98 - (long)__it_00._M_current >> 5;
  if (lVar6 != 1) {
    __it._M_current = __it_00._M_current;
    if (lVar6 != 2) {
      __it._M_current = local_98;
      if ((lVar6 != 3) ||
         (bVar3 = __gnu_cxx::__ops::
                  _Iter_pred<f8n::i18n::Locale::SetSelectedLocale(std::__cxx11::string_const&)::$_0>
                  ::operator()((_Iter_pred<f8n::i18n::Locale::SetSelectedLocale(std::__cxx11::string_const&)::__0>
                                *)&local_f8,__it_00), __it._M_current = __it_00._M_current, bVar3))
      goto LAB_001c4bd4;
      __it._M_current = __it_00._M_current + 1;
    }
    bVar3 = __gnu_cxx::__ops::
            _Iter_pred<f8n::i18n::Locale::SetSelectedLocale(std::__cxx11::string_const&)::$_0>::
            operator()((_Iter_pred<f8n::i18n::Locale::SetSelectedLocale(std::__cxx11::string_const&)::__0>
                        *)&local_f8,__it);
    if (bVar3) goto LAB_001c4bd4;
    __it_00._M_current = __it._M_current + 1;
  }
  bVar3 = __gnu_cxx::__ops::
          _Iter_pred<f8n::i18n::Locale::SetSelectedLocale(std::__cxx11::string_const&)::$_0>::
          operator()((_Iter_pred<f8n::i18n::Locale::SetSelectedLocale(std::__cxx11::string_const&)::__0>
                      *)&local_f8,__it_00);
  __it._M_current = local_98;
  if (bVar3) {
    __it._M_current = __it_00._M_current;
  }
LAB_001c4bd4:
  if (local_f8 != &local_e8) {
    operator_delete(local_f8,local_e8 + 1);
  }
  if (local_b8 != &local_a8) {
    operator_delete(local_b8,local_a8 + 1);
  }
  if (local_d8 != local_c8) {
    operator_delete(local_d8,local_c8[0] + 1);
  }
  if (local_90 != local_80) {
    operator_delete(local_90,local_80[0] + 1);
  }
  if (__it._M_current !=
      (this->locales).
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    pcVar1 = (this->localePath)._M_dataplus._M_p;
    local_d8 = local_c8;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_d8,pcVar1,pcVar1 + (this->localePath)._M_string_length);
    std::__cxx11::string::append((char *)&local_d8);
    plVar4 = (long *)std::__cxx11::string::_M_append
                               ((char *)&local_d8,(ulong)(locale->_M_dataplus)._M_p);
    plVar5 = plVar4 + 2;
    if ((long *)*plVar4 == plVar5) {
      local_a8 = *plVar5;
      lStack_a0 = plVar4[3];
      local_b8 = &local_a8;
    }
    else {
      local_a8 = *plVar5;
      local_b8 = (long *)*plVar4;
    }
    local_b0 = plVar4[1];
    *plVar4 = (long)plVar5;
    plVar4[1] = 0;
    *(undefined1 *)(plVar4 + 2) = 0;
    plVar4 = (long *)std::__cxx11::string::append((char *)&local_b8);
    plVar5 = plVar4 + 2;
    if ((long *)*plVar4 == plVar5) {
      local_e8 = *plVar5;
      lStack_e0 = plVar4[3];
      local_f8 = &local_e8;
    }
    else {
      local_e8 = *plVar5;
      local_f8 = (long *)*plVar4;
    }
    local_f0 = plVar4[1];
    *plVar4 = (long)plVar5;
    plVar4[1] = 0;
    *(undefined1 *)(plVar4 + 2) = 0;
    if (local_b8 != &local_a8) {
      operator_delete(local_b8,local_a8 + 1);
    }
    if (local_d8 != local_c8) {
      operator_delete(local_d8,local_c8[0] + 1);
    }
    loadLocaleData(&local_50);
    nlohmann::json_abi_v3_11_2::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
    ::operator=(&this->localeData,
                (basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                 *)&local_50);
    nlohmann::json_abi_v3_11_2::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
    ::~basic_json((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                   *)&local_50);
    if ((this->localeData).m_type != null) {
      std::__cxx11::string::_M_assign((string *)&this->selectedLocale);
      peVar2 = (this->prefs).super___shared_ptr<f8n::prefs::Preferences,_(__gnu_cxx::_Lock_policy)2>
               ._M_ptr;
      (*(peVar2->super_IPreferences)._vptr_IPreferences[8])
                (peVar2,"default",(this->selectedLocale)._M_dataplus._M_p);
      (*(((this->prefs).super___shared_ptr<f8n::prefs::Preferences,_(__gnu_cxx::_Lock_policy)2>.
         _M_ptr)->super_IPreferences)._vptr_IPreferences[9])();
      pcVar1 = (this->selectedLocale)._M_dataplus._M_p;
      local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_70,pcVar1,pcVar1 + (this->selectedLocale)._M_string_length);
      sigslot::
      signal1<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_sigslot::multi_threaded_local>
      ::operator()(&this->LocaleChanged,&local_70);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_70._M_dataplus._M_p != &local_70.field_2) {
        operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
      }
      if (local_f8 != &local_e8) {
        operator_delete(local_f8,local_e8 + 1);
      }
      return true;
    }
    if (local_f8 != &local_e8) {
      operator_delete(local_f8,local_e8 + 1);
    }
  }
  return false;
}

Assistant:

bool Locale::SetSelectedLocale(const std::string& locale) {
    if (this->defaultLocaleData.is_null()) {
        this->defaultLocaleData = loadLocaleData(localePath + "/" + DEFAULT_LOCALE + ".json");
    }

    auto it = std::find_if(
        this->locales.begin(),
        this->locales.end(),
        [locale](std::string compare) {
            return locale == compare;
        });

    if (it != this->locales.end()) {
        std::string localeFn = this->localePath + "/" + locale + ".json";
        this->localeData = loadLocaleData(localeFn);

        if (!this->localeData.is_null()) {
            this->selectedLocale = locale;

            prefs->SetString(PREFERENCE_KEY_LOCALE, this->selectedLocale.c_str());
            prefs->Save();

            this->LocaleChanged(this->selectedLocale);
            return true;
        }
    }

    return false;
}